

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

void introsort_loop(int *a,int n,int lim)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  int tmp_2;
  uint uVar12;
  ulong uVar13;
  int tmp;
  int tmp_1;
  uint uVar14;
  bool bVar15;
  
  while( true ) {
    if (n < 0x11) {
      return;
    }
    uVar11 = (ulong)(uint)n;
    bVar15 = lim == 0;
    lim = lim + -1;
    if (bVar15) break;
    iVar1 = *a;
    iVar2 = a[(uint)n >> 1];
    iVar3 = a[uVar11 - 1];
    if (iVar2 < iVar1) {
      iVar6 = iVar1;
      if ((iVar3 < iVar1) && (iVar6 = iVar3, iVar3 < iVar2)) {
        iVar6 = iVar2;
      }
    }
    else {
      iVar6 = iVar2;
      if ((iVar3 < iVar2) && (iVar6 = iVar3, iVar3 < iVar1)) {
        iVar6 = iVar1;
      }
    }
    lVar9 = 0;
    uVar11 = (ulong)(uint)n;
    while( true ) {
      lVar7 = (lVar9 << 0x20) + -0x100000000;
      uVar14 = (int)lVar9 - 1;
      lVar9 = (long)(int)lVar9;
      do {
        lVar8 = lVar9;
        lVar7 = lVar7 + 0x100000000;
        iVar1 = a[lVar8];
        lVar9 = lVar8 + 1;
        uVar14 = uVar14 + 1;
      } while (iVar1 <= iVar6);
      uVar11 = (ulong)(int)uVar11;
      do {
        lVar5 = uVar11 - 1;
        uVar11 = uVar11 - 1;
      } while (iVar6 <= a[lVar5]);
      if ((long)uVar11 <= lVar8) break;
      a[lVar8] = a[lVar5];
      a[uVar11] = iVar1;
    }
    introsort_loop((int *)((lVar7 >> 0x1e) + (long)a),n - uVar14,lim);
    n = uVar14;
  }
  uVar13 = 1;
  do {
    if (uVar13 == uVar11) {
      do {
        uVar13 = uVar11;
        if ((long)uVar13 < 2) {
          return;
        }
        uVar11 = uVar13 - 1;
        iVar1 = *a;
        *a = a[uVar11 & 0xffffffff];
        a[uVar11 & 0xffffffff] = iVar1;
        uVar14 = 2;
        uVar12 = 1;
        while ((int)uVar14 < (int)uVar13) {
          uVar10 = uVar14;
          if (((int)uVar14 < (int)uVar11) &&
             (uVar10 = uVar14 | 1, a[(long)(int)(uVar14 | 1) + -1] <= a[(long)(int)uVar14 + -1])) {
            uVar10 = uVar14;
          }
          iVar1 = a[(long)(int)uVar12 + -1];
          if (a[(long)(int)uVar10 + -1] <= iVar1) break;
          a[(long)(int)uVar12 + -1] = a[(long)(int)uVar10 + -1];
          a[(long)(int)uVar10 + -1] = iVar1;
          uVar12 = uVar10;
          uVar14 = uVar10 * 2;
        }
      } while( true );
    }
    iVar1 = a[uVar13];
    uVar13 = uVar13 + 1;
    uVar4 = uVar13;
    do {
      iVar2 = (int)uVar4;
      uVar4 = (long)iVar2 / 2;
      if (iVar1 <= a[(long)(int)uVar4 + -1]) break;
      a[(long)iVar2 + -1] = a[(long)(int)uVar4 + -1];
      a[(long)(int)uVar4 + -1] = iVar1;
    } while (3 < iVar2);
  } while( true );
}

Assistant:

static void
introsort_loop(int *a, int n, int lim)
{
    int p;
    while (n > 16) {
        if (lim == 0) {
            heap_sort(a, n);
            return;
        }
        --lim;
        p = partition(a, n, median(a[0], a[n/2], a[n-1]));
        introsort_loop(a + p, n - p, lim);
        n = p;
    }
}